

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_axi.c
# Opt level: O2

REF_STATUS ref_axi_wedge(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  ulong uVar5;
  long lVar6;
  REF_INT RVar7;
  ulong uVar8;
  long lVar9;
  REF_GLOB global;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  double dVar15;
  undefined8 uStackY_110;
  REF_INT nunique;
  REF_INT pri_nodes [8];
  REF_INT new_nodes [8];
  REF_INT new_cell;
  REF_INT pyr_nodes [8];
  REF_INT nodes [8];
  REF_INT unique [8];
  
  ref_node = ref_grid->node;
  uVar8 = (ulong)ref_node->n;
  if ((long)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
           "ref_axi_wedge","malloc o2n of REF_INT negative");
LAB_00129570:
    RVar4 = 1;
  }
  else {
    __ptr = malloc(uVar8 * 4);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",0x31,
             "ref_axi_wedge","malloc o2n of REF_INT NULL");
      RVar4 = 2;
    }
    else {
      for (uVar5 = 0; uVar5 < uVar8; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)__ptr + uVar5 * 4) = 0xffffffff;
      }
      lVar6 = ref_node->old_n_global / 2;
      uVar8 = (ulong)(uint)ref_node->max;
      lVar13 = 1;
      lVar12 = 0;
      for (lVar9 = 0; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
        lVar10 = ref_node->global[lVar9];
        if (-1 < lVar10) {
          dVar15 = ref_node->real[lVar13 + 1];
          if (dVar15 <= -dVar15) {
            dVar15 = -dVar15;
          }
          RVar7 = (REF_INT)lVar9;
          if (1e-06 <= dVar15) {
LAB_001294a5:
            *(REF_INT *)((long)__ptr + lVar9 * 4) = RVar7;
          }
          else {
            dVar15 = ref_node->real[lVar13];
            if (dVar15 <= -dVar15) {
              dVar15 = -dVar15;
            }
            if (dVar15 <= 0.5) goto LAB_001294a5;
            global = lVar10 - lVar6;
            if (lVar10 < lVar6) {
              puts("not expecting less than half, unless unit test");
              lVar10 = -1;
              if (lVar9 < ref_node->max) {
                lVar10 = ref_node->global[lVar9];
                if (ref_node->global[lVar9] < 0) {
                  lVar10 = -1;
                }
              }
              global = lVar10 + lVar6;
            }
            uVar3 = ref_node_local(ref_node,global,(REF_INT *)((long)__ptr + lVar12));
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar11 = "localize";
              uStackY_110 = 0x42;
              goto LAB_001295a1;
            }
            if (ref_node->ref_mpi->id == ref_node->part[lVar9]) {
              uVar3 = ref_node_remove(ref_node,RVar7);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar11 = "remove";
                uStackY_110 = 0x45;
                goto LAB_001295a1;
              }
            }
            else {
              uVar3 = ref_node_remove_without_global(ref_node,RVar7);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar11 = "remove";
                uStackY_110 = 0x47;
                goto LAB_001295a1;
              }
            }
          }
          uVar8 = (ulong)ref_node->max;
          if ((lVar9 < (long)uVar8) && (-1 < ref_node->global[lVar9])) {
            pRVar1 = ref_node->real;
            dVar15 = pRVar1[lVar13];
            if (dVar15 <= -dVar15) {
              dVar15 = -dVar15;
            }
            if (0.5 < dVar15) {
              pRVar1[lVar13] = pRVar1[lVar13 + 1] * 0.017452406437283494;
              (pRVar1 + lVar13)[1] = pRVar1[lVar13 + 1] * 0.9998476951563913;
            }
          }
        }
        lVar13 = lVar13 + 0xf;
        lVar12 = lVar12 + 4;
      }
      uVar3 = ref_node_synchronize_globals(ref_node);
      if (uVar3 == 0) {
        pRVar2 = ref_grid->cell[3];
        for (iVar14 = 0; iVar14 < pRVar2->max; iVar14 = iVar14 + 1) {
          RVar4 = ref_cell_nodes(pRVar2,iVar14,nodes);
          if (RVar4 == 0) {
            for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
              new_nodes[lVar13] = *(REF_INT *)((long)__ptr + (long)nodes[lVar13] * 4);
            }
            new_nodes[3] = nodes[3];
            uVar3 = ref_cell_replace_whole(pRVar2,iVar14,new_nodes);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar11 = "renum";
              uStackY_110 = 0x5b;
              goto LAB_001295a1;
            }
          }
        }
        pRVar2 = ref_grid->cell[6];
        for (iVar14 = 0; iVar14 < pRVar2->max; iVar14 = iVar14 + 1) {
          RVar4 = ref_cell_nodes(pRVar2,iVar14,nodes);
          if (RVar4 == 0) {
            for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
              new_nodes[lVar13] = *(REF_INT *)((long)__ptr + (long)nodes[lVar13] * 4);
            }
            new_nodes[4] = nodes[4];
            uVar3 = ref_sort_unique_int(4,new_nodes,&nunique,unique);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar11 = "uniq";
              uStackY_110 = 99;
              goto LAB_001295a1;
            }
            if (nunique < 4) {
              uVar3 = ref_cell_remove(pRVar2,iVar14);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar11 = "rm qua";
                uStackY_110 = 100;
                goto LAB_001295a1;
              }
              if (nunique == 3) {
                if (new_nodes[2] == new_nodes[3]) {
                  new_nodes[3] = new_nodes[4];
                }
                RVar7 = new_nodes[3];
                if (new_nodes[1] == new_nodes[2]) {
                  new_nodes[3] = new_nodes[4];
                  new_nodes[2] = RVar7;
                }
                RVar7 = new_nodes[3];
                if (new_nodes[0] == new_nodes[1]) {
                  new_nodes[3] = new_nodes[4];
                  new_nodes[1] = new_nodes[2];
                  new_nodes[2] = RVar7;
                }
                RVar7 = new_nodes[2];
                if (new_nodes[3] == new_nodes[0]) {
                  new_nodes[2] = new_nodes[0];
                  new_nodes[3] = new_nodes[4];
                  new_nodes[0] = new_nodes[1];
                  new_nodes[1] = RVar7;
                }
                uVar3 = ref_cell_add(ref_grid->cell[3],new_nodes,&new_cell);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar11 = "new cell";
                  uStackY_110 = 0x79;
                  goto LAB_001295a1;
                }
              }
            }
            if (nunique == 4) {
              for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
                new_nodes[lVar13] = *(REF_INT *)((long)__ptr + (long)nodes[lVar13] * 4);
              }
              new_nodes[4] = nodes[4];
              uVar3 = ref_cell_replace_whole(pRVar2,iVar14,new_nodes);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar11 = "renum";
                uStackY_110 = 0x7e;
                goto LAB_001295a1;
              }
            }
          }
        }
        pRVar2 = ref_grid->cell[10];
        for (iVar14 = 0; iVar14 < pRVar2->max; iVar14 = iVar14 + 1) {
          RVar4 = ref_cell_nodes(pRVar2,iVar14,nodes);
          if (RVar4 == 0) {
            for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
              new_nodes[lVar13] = *(REF_INT *)((long)__ptr + (long)nodes[lVar13] * 4);
            }
            uVar3 = ref_sort_unique_int(6,new_nodes,&nunique,unique);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar11 = "uniq";
              uStackY_110 = 0x86;
              goto LAB_001295a1;
            }
            if (nunique < 6) {
              uVar3 = ref_cell_remove(pRVar2,iVar14);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar11 = "rm qua";
                uStackY_110 = 0x87;
                goto LAB_001295a1;
              }
              if (nunique == 5) {
                if (new_nodes[0] == new_nodes[3]) {
                  pyr_nodes[0] = new_nodes[1];
                  pyr_nodes[1] = new_nodes[2];
                  pyr_nodes[2] = new_nodes[0];
                  pyr_nodes[3] = new_nodes[4];
                  pyr_nodes[4] = new_nodes[5];
                }
                if (new_nodes[1] == new_nodes[4]) {
                  pyr_nodes[0] = new_nodes[2];
                  pyr_nodes[1] = new_nodes[0];
                  pyr_nodes[2] = new_nodes[1];
                  pyr_nodes[3] = new_nodes[5];
                  pyr_nodes[4] = new_nodes[3];
                }
                if (new_nodes[2] == new_nodes[5]) {
                  pyr_nodes[0] = new_nodes[0];
                  pyr_nodes[1] = new_nodes[1];
                  pyr_nodes[2] = new_nodes[2];
                  pyr_nodes[3] = new_nodes[3];
                  pyr_nodes[4] = new_nodes[4];
                }
                uVar3 = ref_cell_add(ref_grid->cell[9],pyr_nodes,&new_cell);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar11 = "new cell";
                  uStackY_110 = 0x9f;
                  goto LAB_001295a1;
                }
              }
              if (nunique == 4) {
                if (new_nodes[1] != new_nodes[4]) {
                  new_nodes[3] = new_nodes[4];
                }
                if (new_nodes[2] != new_nodes[5]) {
                  new_nodes[3] = new_nodes[5];
                }
                uVar3 = ref_cell_add(ref_grid->cell[8],new_nodes,&new_cell);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar11 = "new cell";
                  uStackY_110 = 0xa5;
                  goto LAB_001295a1;
                }
              }
            }
          }
        }
        pRVar2 = ref_grid->cell[0xb];
        for (iVar14 = 0; iVar14 < pRVar2->max; iVar14 = iVar14 + 1) {
          RVar4 = ref_cell_nodes(pRVar2,iVar14,nodes);
          if (RVar4 == 0) {
            for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
              new_nodes[lVar13] = *(REF_INT *)((long)__ptr + (long)nodes[lVar13] * 4);
            }
            uVar3 = ref_sort_unique_int(8,new_nodes,&nunique,unique);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar11 = "uniq";
              uStackY_110 = 0xad;
              goto LAB_001295a1;
            }
            if (nunique != 8) {
              if (nunique < 8) {
                uVar3 = ref_cell_remove(pRVar2,iVar14);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar11 = "rm qua";
                  uStackY_110 = 0xaf;
                  goto LAB_001295a1;
                }
                if (nunique == 6) {
                  pri_nodes[0] = -1;
                  if ((new_nodes[0] == new_nodes[1]) && (new_nodes[4] == new_nodes[5])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[2];
                    pri_nodes[2] = new_nodes[3];
                    pri_nodes[3] = new_nodes[4];
                    pri_nodes[4] = new_nodes[6];
                    pri_nodes[5] = new_nodes[7];
                  }
                  if (new_nodes[1] == new_nodes[5] && (new_nodes[0] ^ new_nodes[4]) == 0) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[3];
                    pri_nodes[2] = new_nodes[7];
                    pri_nodes[3] = new_nodes[1];
                    pri_nodes[4] = new_nodes[2];
                    pri_nodes[5] = new_nodes[6];
                  }
                  if ((new_nodes[1] == new_nodes[2]) && (new_nodes[5] == new_nodes[6])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[1];
                    pri_nodes[2] = new_nodes[3];
                    pri_nodes[3] = new_nodes[4];
                    pri_nodes[4] = new_nodes[5];
                    pri_nodes[5] = new_nodes[7];
                  }
                  if ((new_nodes[1] == new_nodes[5]) && (new_nodes[2] == new_nodes[6])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[4];
                    pri_nodes[2] = new_nodes[1];
                    pri_nodes[3] = new_nodes[0];
                    pri_nodes[4] = new_nodes[7];
                    pri_nodes[5] = new_nodes[6];
                  }
                  if ((new_nodes[3] == new_nodes[7]) && (new_nodes[2] == new_nodes[6])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[7];
                    pri_nodes[2] = new_nodes[4];
                    pri_nodes[3] = new_nodes[1];
                    pri_nodes[4] = new_nodes[6];
                    pri_nodes[5] = new_nodes[5];
                  }
                  if ((new_nodes[3] == new_nodes[2]) && (new_nodes[7] == new_nodes[6])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[1];
                    pri_nodes[2] = new_nodes[2];
                    pri_nodes[3] = new_nodes[4];
                    pri_nodes[4] = new_nodes[5];
                    pri_nodes[5] = new_nodes[6];
                  }
                  if ((new_nodes[0] ^ new_nodes[4]) == 0 && new_nodes[3] == new_nodes[7]) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[5];
                    pri_nodes[2] = new_nodes[1];
                    pri_nodes[3] = new_nodes[7];
                    pri_nodes[4] = new_nodes[6];
                    pri_nodes[5] = new_nodes[1];
                  }
                  if ((new_nodes[0] ^ new_nodes[3]) == 0 && (new_nodes[4] ^ new_nodes[7]) == 0) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[1];
                    pri_nodes[2] = new_nodes[2];
                    pri_nodes[3] = new_nodes[4];
                    pri_nodes[4] = new_nodes[5];
                    pri_nodes[5] = new_nodes[6];
                  }
                  if (new_nodes[0] == new_nodes[1] && new_nodes[3] == new_nodes[2]) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[4];
                    pri_nodes[2] = new_nodes[5];
                    pri_nodes[3] = new_nodes[2];
                    pri_nodes[4] = new_nodes[7];
                    pri_nodes[5] = new_nodes[6];
                  }
                  if (new_nodes[1] == new_nodes[2] && (new_nodes[0] ^ new_nodes[3]) == 0) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[7];
                    pri_nodes[2] = new_nodes[4];
                    pri_nodes[3] = new_nodes[1];
                    pri_nodes[4] = new_nodes[6];
                    pri_nodes[5] = new_nodes[5];
                  }
                  if ((new_nodes[4] == new_nodes[5]) && (new_nodes[7] == new_nodes[6])) {
                    pri_nodes[0] = new_nodes[0];
                    pri_nodes[1] = new_nodes[4];
                    pri_nodes[2] = new_nodes[1];
                    pri_nodes[3] = new_nodes[0];
                    pri_nodes[4] = new_nodes[6];
                    pri_nodes[5] = new_nodes[2];
                  }
                  if ((new_nodes[4] ^ new_nodes[7]) == 0 && new_nodes[6] == new_nodes[5]) {
                    pri_nodes[0] = new_nodes[1];
                    pri_nodes[1] = new_nodes[5];
                    pri_nodes[2] = new_nodes[2];
                    pri_nodes[3] = new_nodes[0];
                    pri_nodes[4] = new_nodes[4];
                    pri_nodes[5] = new_nodes[3];
                  }
                  uVar3 = ref_cell_add(ref_grid->cell[10],pri_nodes,&new_cell);
                  if (uVar3 == 0) goto LAB_00129c8f;
                  uVar8 = (ulong)uVar3;
                  pcVar11 = "new cell";
                  uStackY_110 = 0x126;
                  goto LAB_001295a1;
                }
              }
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c"
                     ,0xb0,"ref_axi_wedge","expected 6 unique hex nodes on pole",6,(long)nunique);
              goto LAB_00129570;
            }
          }
LAB_00129c8f:
        }
        free(__ptr);
        RVar4 = 0;
      }
      else {
        uVar8 = (ulong)uVar3;
        pcVar11 = "sync";
        uStackY_110 = 0x54;
LAB_001295a1:
        RVar4 = (REF_STATUS)uVar8;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_axi.c",
               uStackY_110,"ref_axi_wedge",uVar8,pcVar11);
      }
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_axi_wedge(REF_GRID ref_grid) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL pole_tol;
  REF_INT *o2n, node;
  REF_GLOB nhalf, global;

  REF_INT cell, nodes[8], new_nodes[8], pyr_nodes[8], pri_nodes[8];
  REF_INT nunique, unique[8];
  REF_INT new_cell;

  REF_DBL radius, wedge_angle;

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(o2n, ref_node_n(ref_node), REF_INT, REF_EMPTY);

  pole_tol = 1.0e-6; /* drop to smaller number */
  wedge_angle = ref_math_in_radians(1.0);

  /* make half logic globals, RCB can scrambles local indexes */
  nhalf = ref_node_n_global(ref_node) / 2;
  each_ref_node_valid_node(ref_node, node) {
    if (ABS(ref_node_xyz(ref_node, 2, node)) < pole_tol &&
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      if (ref_node_global(ref_node, node) < nhalf) {
        printf("not expecting less than half, unless unit test\n");
        global = ref_node_global(ref_node, node) + nhalf;
      } else {
        /* set to pair on plane that is kept */
        global = ref_node_global(ref_node, node) - nhalf;
      }
      RSS(ref_node_local(ref_node, global, &(o2n[node])), "localize");
      /* remove if you own it, remove without global if you don't own it */
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_node_remove(ref_node, node), "remove");
      } else {
        RSS(ref_node_remove_without_global(ref_node, node), "remove");
      }
    } else {
      o2n[node] = node;
    }
    if (ref_node_valid(ref_node, node) && /* ignore collapsed nodes */
        ABS(ref_node_xyz(ref_node, 1, node)) > 0.5) {
      radius = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 1, node) = radius * sin(wedge_angle);
      ref_node_xyz(ref_node, 2, node) = radius * cos(wedge_angle);
    }
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 3; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[3] = nodes[3];
    RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
  }

  ref_cell = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
    new_nodes[4] = nodes[4];
    RSS(ref_sort_unique_int(4, new_nodes, &nunique, unique), "uniq");
    if (4 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (3 == nunique) {
      if (new_nodes[2] == new_nodes[3]) {
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[1] == new_nodes[2]) {
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[0] == new_nodes[1]) {
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      if (new_nodes[3] == new_nodes[0]) {
        new_nodes[0] = new_nodes[1];
        new_nodes[1] = new_nodes[2];
        new_nodes[2] = new_nodes[3];
        new_nodes[3] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_tri(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      for (node = 0; node < 4; node++) new_nodes[node] = o2n[nodes[node]];
      new_nodes[4] = nodes[4];
      RSS(ref_cell_replace_whole(ref_cell, cell, new_nodes), "renum");
    }
  }

  ref_cell = ref_grid_pri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 6; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(6, new_nodes, &nunique, unique), "uniq");
    if (6 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    if (5 == nunique) {
      if (new_nodes[0] == new_nodes[3]) {
        pyr_nodes[0] = new_nodes[1];
        pyr_nodes[1] = new_nodes[2];
        pyr_nodes[2] = new_nodes[0];
        pyr_nodes[3] = new_nodes[4];
        pyr_nodes[4] = new_nodes[5];
      }
      if (new_nodes[1] == new_nodes[4]) {
        pyr_nodes[0] = new_nodes[2];
        pyr_nodes[1] = new_nodes[0];
        pyr_nodes[2] = new_nodes[1];
        pyr_nodes[3] = new_nodes[5];
        pyr_nodes[4] = new_nodes[3];
      }
      if (new_nodes[2] == new_nodes[5]) {
        pyr_nodes[0] = new_nodes[0];
        pyr_nodes[1] = new_nodes[1];
        pyr_nodes[2] = new_nodes[2];
        pyr_nodes[3] = new_nodes[3];
        pyr_nodes[4] = new_nodes[4];
      }
      RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
          "new cell");
    }
    if (4 == nunique) {
      if (new_nodes[1] != new_nodes[4]) new_nodes[3] = new_nodes[4];
      if (new_nodes[2] != new_nodes[5]) new_nodes[3] = new_nodes[5];
      RSS(ref_cell_add(ref_grid_tet(ref_grid), new_nodes, &new_cell),
          "new cell");
    }
  }

  ref_cell = ref_grid_hex(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < 8; node++) new_nodes[node] = o2n[nodes[node]];
    RSS(ref_sort_unique_int(8, new_nodes, &nunique, unique), "uniq");
    if (8 == nunique) continue;
    if (8 > nunique) RSS(ref_cell_remove(ref_cell, cell), "rm qua");
    REIS(6, nunique, "expected 6 unique hex nodes on pole");
    if (6 == nunique) {
      pri_nodes[0] = REF_EMPTY;

      /* 0: 0 4 5 1 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[4] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[2];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[0] == new_nodes[4] && new_nodes[1] == new_nodes[5]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[7];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[6];
      }

      /* 1: 1 5 6 2 */
      if (new_nodes[1] == new_nodes[2] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[3];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[7];
      }
      if (new_nodes[1] == new_nodes[5] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }

      /* 2: 2 6 7 3 */
      if (new_nodes[3] == new_nodes[7] && new_nodes[2] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[3];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[2];
        pri_nodes[5] = new_nodes[5];
      }
      if (new_nodes[3] == new_nodes[2] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 3: 0 3 7 4 */
      if (new_nodes[0] == new_nodes[4] && new_nodes[3] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[1];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[4] == new_nodes[7]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[1];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[4];
        pri_nodes[4] = new_nodes[5];
        pri_nodes[5] = new_nodes[6];
      }

      /* 4: 0 1 2 3 */
      if (new_nodes[0] == new_nodes[1] && new_nodes[3] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[5];
        pri_nodes[3] = new_nodes[3];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[6];
      }
      if (new_nodes[0] == new_nodes[3] && new_nodes[1] == new_nodes[2]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[7];
        pri_nodes[2] = new_nodes[4];
        pri_nodes[3] = new_nodes[1];
        pri_nodes[4] = new_nodes[6];
        pri_nodes[5] = new_nodes[5];
      }

      /* 5: 4 7 6 5 */
      if (new_nodes[4] == new_nodes[5] && new_nodes[7] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[0];
        pri_nodes[1] = new_nodes[4];
        pri_nodes[2] = new_nodes[1];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[7];
        pri_nodes[5] = new_nodes[2];
      }
      if (new_nodes[4] == new_nodes[7] && new_nodes[5] == new_nodes[6]) {
        pri_nodes[0] = new_nodes[1];
        pri_nodes[1] = new_nodes[5];
        pri_nodes[2] = new_nodes[2];
        pri_nodes[3] = new_nodes[0];
        pri_nodes[4] = new_nodes[4];
        pri_nodes[5] = new_nodes[3];
      }

      /*
      printf(" new %d %d %d %d    %d %d %d %d\n", new_nodes[0], new_nodes[1],
             new_nodes[2], new_nodes[3], new_nodes[4], new_nodes[5],
             new_nodes[6], new_nodes[7]);
             */
      RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_cell),
          "new cell");
    }
  }

  ref_free(o2n);

  return REF_SUCCESS;
}